

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testutil.h
# Opt level: O2

int CompareMat(Mat *a,Mat *b,float epsilon)

{
  float fVar1;
  float fVar2;
  int iVar3;
  uint uVar4;
  ulong uVar5;
  ulong uVar6;
  ulong uVar7;
  void *pvVar8;
  char *__format;
  ulong uVar9;
  void *pvVar10;
  int q;
  uint _c;
  float fVar11;
  Mat a1;
  Mat local_70;
  
  if (a->elempack != 1) {
    a1.elemsize._0_4_ = 0;
    a1.elemsize._4_4_ = 0;
    a1.elempack = 0;
    a1.data = (void *)0x0;
    a1.refcount._0_4_ = 0;
    a1.refcount._4_4_ = 0;
    a1.allocator = (Allocator *)0x0;
    a1.dims = 0;
    a1.w = 0;
    a1.h = 0;
    a1.c = 0;
    a1.cstep = 0;
    ncnn::Option::Option((Option *)&local_70);
    ncnn::convert_packing(a,&a1,1,(Option *)&local_70);
    iVar3 = CompareMat(&a1,b,epsilon);
LAB_00112f03:
    ncnn::Mat::~Mat(&a1);
    return iVar3;
  }
  if (b->elempack != 1) {
    a1.elemsize._0_4_ = 0;
    a1.elemsize._4_4_ = 0;
    a1.elempack = 0;
    a1.data = (void *)0x0;
    a1.refcount._0_4_ = 0;
    a1.refcount._4_4_ = 0;
    a1.allocator = (Allocator *)0x0;
    a1.dims = 0;
    a1.w = 0;
    a1.h = 0;
    a1.c = 0;
    a1.cstep = 0;
    ncnn::Option::Option((Option *)&local_70);
    ncnn::convert_packing(b,&a1,1,(Option *)&local_70);
    iVar3 = CompareMat(a,&a1,epsilon);
    goto LAB_00112f03;
  }
  uVar5 = a->elemsize;
  if (uVar5 == 1) {
    a1.elemsize._0_4_ = 0;
    a1.elemsize._4_4_ = 0;
    a1.elempack = 0;
    a1.data = (void *)0x0;
    a1.refcount._0_4_ = 0;
    a1.refcount._4_4_ = 0;
    a1.allocator = (Allocator *)0x0;
    a1.dims = 0;
    a1.w = 0;
    a1.h = 0;
    a1.c = 0;
    a1.cstep = 0;
    ncnn::Option::Option((Option *)&local_70);
    ncnn::cast_int8_to_float32(a,&a1,(Option *)&local_70);
    iVar3 = CompareMat(&a1,b,epsilon);
    goto LAB_00112f03;
  }
  if (uVar5 == 2) {
    a1.elemsize._0_4_ = 0;
    a1.elemsize._4_4_ = 0;
    a1.elempack = 0;
    a1.data = (void *)0x0;
    a1.refcount._0_4_ = 0;
    a1.refcount._4_4_ = 0;
    a1.allocator = (Allocator *)0x0;
    a1.dims = 0;
    a1.w = 0;
    a1.h = 0;
    a1.c = 0;
    a1.cstep = 0;
    ncnn::Option::Option((Option *)&local_70);
    ncnn::cast_float16_to_float32(a,&a1,(Option *)&local_70);
    iVar3 = CompareMat(&a1,b,epsilon);
    goto LAB_00112f03;
  }
  uVar7 = b->elemsize;
  if (uVar7 == 1) {
    a1.elemsize._0_4_ = 0;
    a1.elemsize._4_4_ = 0;
    a1.elempack = 0;
    a1.data = (void *)0x0;
    a1.refcount._0_4_ = 0;
    a1.refcount._4_4_ = 0;
    a1.allocator = (Allocator *)0x0;
    a1.dims = 0;
    a1.w = 0;
    a1.h = 0;
    a1.c = 0;
    a1.cstep = 0;
    ncnn::Option::Option((Option *)&local_70);
    ncnn::cast_int8_to_float32(b,&a1,(Option *)&local_70);
    iVar3 = CompareMat(a,&a1,epsilon);
    goto LAB_00112f03;
  }
  if (uVar7 == 2) {
    a1.elemsize._0_4_ = 0;
    a1.elemsize._4_4_ = 0;
    a1.elempack = 0;
    a1.data = (void *)0x0;
    a1.refcount._0_4_ = 0;
    a1.refcount._4_4_ = 0;
    a1.allocator = (Allocator *)0x0;
    a1.dims = 0;
    a1.w = 0;
    a1.h = 0;
    a1.c = 0;
    a1.cstep = 0;
    ncnn::Option::Option((Option *)&local_70);
    ncnn::cast_float16_to_float32(b,&a1,(Option *)&local_70);
    iVar3 = CompareMat(a,&a1,epsilon);
    goto LAB_00112f03;
  }
  uVar4 = a->dims;
  if (uVar4 == b->dims) {
    uVar4 = a->w;
    if (uVar4 == b->w) {
      uVar4 = a->h;
      if (uVar4 == b->h) {
        uVar4 = a->c;
        if (uVar4 == b->c) {
          if (uVar5 == uVar7) {
            _c = 0;
            do {
              if ((int)uVar4 <= (int)_c) {
LAB_00113095:
                return -(uint)((int)_c < (int)uVar4);
              }
              ncnn::Mat::channel(&a1,a,_c);
              ncnn::Mat::channel(&local_70,b,_c);
              uVar5 = (ulong)(uint)a->w;
              if (a->w < 1) {
                uVar5 = 0;
              }
              uVar7 = (ulong)(uint)a->h;
              if (a->h < 1) {
                uVar7 = 0;
              }
              pvVar8 = a1.data;
              pvVar10 = local_70.data;
              for (uVar6 = 0; uVar6 != uVar7; uVar6 = uVar6 + 1) {
                for (uVar9 = 0; uVar5 != uVar9; uVar9 = uVar9 + 1) {
                  fVar1 = *(float *)((long)pvVar8 + uVar9 * 4);
                  fVar2 = *(float *)((long)pvVar10 + uVar9 * 4);
                  if (((fVar1 != fVar2) || (NAN(fVar1) || NAN(fVar2))) &&
                     (epsilon < ABS(fVar1 - fVar2))) {
                    fVar11 = ABS(fVar2);
                    if (ABS(fVar2) <= ABS(fVar1)) {
                      fVar11 = ABS(fVar1);
                    }
                    if (fVar11 * epsilon <= ABS(fVar1 - fVar2)) {
                      fprintf(_stderr,"value not match  at c:%d h:%d w:%d    expect %f but got %f\n"
                              ,SUB84((double)fVar1,0),(double)fVar2,(ulong)_c);
                      ncnn::Mat::~Mat(&local_70);
                      ncnn::Mat::~Mat(&a1);
                      goto LAB_00113095;
                    }
                  }
                }
                pvVar10 = (void *)((long)pvVar10 + (long)local_70.w * local_70.elemsize);
                pvVar8 = (void *)((long)pvVar8 +
                                 (long)a1.w * CONCAT44(a1.elemsize._4_4_,(undefined4)a1.elemsize));
              }
              ncnn::Mat::~Mat(&local_70);
              ncnn::Mat::~Mat(&a1);
              _c = _c + 1;
              uVar4 = a->c;
            } while( true );
          }
          __format = "elemsize not match    expect %d but got %d\n";
        }
        else {
          __format = "c not match    expect %d but got %d\n";
          uVar5 = (ulong)uVar4;
          uVar7 = (ulong)(uint)b->c;
        }
        goto LAB_0011310a;
      }
      __format = "h not match    expect %d but got %d\n";
      uVar7 = (ulong)(uint)b->h;
    }
    else {
      __format = "w not match    expect %d but got %d\n";
      uVar7 = (ulong)(uint)b->w;
    }
  }
  else {
    __format = "dims not match    expect %d but got %d\n";
    uVar7 = (ulong)(uint)b->dims;
  }
  uVar5 = (ulong)uVar4;
LAB_0011310a:
  fprintf(_stderr,__format,uVar5,uVar7);
  return -1;
}

Assistant:

static int CompareMat(const ncnn::Mat& a, const ncnn::Mat& b, float epsilon = 0.001)
{
    if (a.elempack != 1)
    {
        ncnn::Mat a1;
        ncnn::convert_packing(a, a1, 1);
        return CompareMat(a1, b, epsilon);
    }

    if (b.elempack != 1)
    {
        ncnn::Mat b1;
        ncnn::convert_packing(b, b1, 1);
        return CompareMat(a, b1, epsilon);
    }

    if (a.elemsize == 2u)
    {
        ncnn::Mat a32;
        cast_float16_to_float32(a, a32);
        return CompareMat(a32, b, epsilon);
    }
    if (a.elemsize == 1u)
    {
        ncnn::Mat a32;
        cast_int8_to_float32(a, a32);
        return CompareMat(a32, b, epsilon);
    }

    if (b.elemsize == 2u)
    {
        ncnn::Mat b32;
        cast_float16_to_float32(b, b32);
        return CompareMat(a, b32, epsilon);
    }
    if (b.elemsize == 1u)
    {
        ncnn::Mat b32;
        cast_int8_to_float32(b, b32);
        return CompareMat(a, b32, epsilon);
    }

    return Compare(a, b, epsilon);
}